

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.hpp
# Opt level: O2

bool __thiscall
deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[3]>::isPostguardContaminated
          (StateQueryMemoryWriteGuard<int[3]> *this)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (uVar2 == 0xc) break;
    uVar1 = uVar2 + 1;
  } while (*(char *)((long)this->m_postguard + uVar2) == -0x22);
  return uVar2 < 0xc;
}

Assistant:

bool StateQueryMemoryWriteGuard<T>::isPostguardContaminated (void) const
{
	for (size_t i = 0; i < sizeof(T); ++i)
		if (((deUint8*)&m_postguard)[i] != (deUint8)WRITE_GUARD_VALUE)
			return true;
	return false;
}